

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ay8910.c
# Opt level: O1

void ay8910_set_stereo_mask(void *chip,UINT32 StereoMask)

{
  UINT8 CurChn;
  long lVar1;
  
  lVar1 = 0;
  do {
    *(byte *)((long)chip + lVar1 + 0x2b8) = (byte)StereoMask & 3;
    StereoMask = StereoMask >> 2;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  return;
}

Assistant:

void ay8910_set_stereo_mask(void *chip, UINT32 StereoMask)
{
	ay8910_context *psg = (ay8910_context *)chip;
	UINT8 CurChn;
	
	for (CurChn = 0; CurChn < NUM_CHANNELS; CurChn ++)
	{
		psg->StereoMask[CurChn] = StereoMask & 0x03;
		StereoMask >>= 2;
	}
	
	return;
}